

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t best_effort_strncat_to_utf16
                  (archive_string *as16,void *_p,size_t length,archive_string_conv *sc,
                  wchar_t bigendian)

{
  char cVar1;
  wchar_t wVar2;
  archive_string *paVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  short sVar7;
  char cVar8;
  char cVar9;
  
  paVar3 = archive_string_ensure(as16,as16->length + length * 2 + 2);
  if (paVar3 == (archive_string *)0x0) {
    wVar2 = L'\xffffffff';
  }
  else {
    pcVar4 = as16->s + as16->length;
    wVar2 = L'\0';
    pcVar5 = pcVar4;
    for (sVar6 = 0; length != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = *_p;
      sVar7 = (short)cVar1;
      _p = (void *)((long)_p + 1);
      if (cVar1 < '\0') {
        wVar2 = L'\xffffffff';
        sVar7 = -3;
      }
      cVar9 = (char)((ushort)sVar7 >> 8);
      cVar8 = cVar9;
      cVar1 = (char)sVar7;
      if ((int)sc == 0) {
        cVar8 = (char)sVar7;
        cVar1 = cVar9;
      }
      pcVar4[sVar6 * 2] = cVar8;
      pcVar4[sVar6 * 2 + 1] = cVar1;
      pcVar5 = pcVar5 + 2;
    }
    as16->length = (long)pcVar5 - (long)as16->s;
    *pcVar5 = '\0';
    as16->s[as16->length + 1] = '\0';
  }
  return wVar2;
}

Assistant:

static int
best_effort_strncat_to_utf16(struct archive_string *as16, const void *_p,
    size_t length, struct archive_string_conv *sc, int bigendian)
{
	const char *s = (const char *)_p;
	char *utf16;
	size_t remaining;
	int ret;

	(void)sc; /* UNUSED */
	/*
	 * Other case, we should do the best effort.
	 * If all character are ASCII(<0x7f), we can convert it.
	 * if not , we set a alternative character and return -1.
	 */
	ret = 0;
	remaining = length;

	if (archive_string_ensure(as16,
	    as16->length + (length + 1) * 2) == NULL)
		return (-1);

	utf16 = as16->s + as16->length;
	while (remaining--) {
		unsigned c = *s++;
		if (c > 127) {
			/* We cannot handle it. */
			c = UNICODE_R_CHAR;
			ret = -1;
		}
		if (bigendian)
			archive_be16enc(utf16, c);
		else
			archive_le16enc(utf16, c);
		utf16 += 2;
	}
	as16->length = utf16 - as16->s;
	as16->s[as16->length] = 0;
	as16->s[as16->length+1] = 0;
	return (ret);
}